

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O3

void __thiscall
pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>::ParamArray
          (ParamArray<pbrt::syntactic::Texture> *this,string *type)

{
  pointer pcVar1;
  
  (this->super_Param).super_enable_shared_from_this<pbrt::syntactic::Param>._M_weak_this.
  super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Param).super_enable_shared_from_this<pbrt::syntactic::Param>._M_weak_this.
  super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Param)._vptr_Param = (_func_int **)&PTR_getType_abi_cxx11__001791d0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type,pcVar1,pcVar1 + type->_M_string_length);
  (this->texture).super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->texture).super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

virtual std::string getType() const { return type; }